

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O1

void __thiscall Assimp::LWO::AnimResolver::ClearAnimRangeSetup(AnimResolver *this)

{
  void *__src;
  _List_node_base *p_Var1;
  _List_node_base *__dest;
  size_t sVar2;
  size_t sVar3;
  size_t __n;
  _List_node_base *p_Var4;
  size_t sVar5;
  
  p_Var4 = (this->envelopes->
           super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)this->envelopes) {
    do {
      p_Var1 = *(_List_node_base **)
                &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                 ((long)(p_Var4 + 3) + 8))->_M_impl;
      if (p_Var1 != (_List_node_base *)0x0) {
        __dest = *(_List_node_base **)
                  &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                   (p_Var4 + 2))->_M_impl;
        __src = (void *)((long)__dest + (long)p_Var1 * 0x28);
        __n = *(size_t *)
               &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                ((long)(p_Var4 + 2) + 8))->_M_impl - (long)__src;
        if (__n != 0) {
          memmove(__dest,__src,__n);
        }
        sVar2 = *(size_t *)
                 &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                  ((long)(p_Var4 + 2) + 8))->_M_impl;
        sVar5 = (long)__dest + (sVar2 - (long)__src);
        if (sVar2 != sVar5) {
          *(size_t *)
           &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
            ((long)(p_Var4 + 2) + 8))->_M_impl = sVar5;
        }
      }
      sVar2 = *(size_t *)
               &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                ((long)(p_Var4 + 2) + 8))->_M_impl;
      sVar5 = (long)*(_List_node_base **)
                     &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                      (p_Var4 + 2))->_M_impl +
              *(size_t *)
               &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                (p_Var4 + 4))->_M_impl * 0x28 + 0x28;
      if ((sVar5 != sVar2) &&
         (sVar3 = *(size_t *)
                   &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                    ((long)(p_Var4 + 2) + 8))->_M_impl, sVar5 = sVar5 + (sVar3 - sVar2),
         sVar3 != sVar5)) {
        *(size_t *)
         &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
          ((long)(p_Var4 + 2) + 8))->_M_impl = sVar5;
      }
      p_Var4 = (((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)this->envelopes);
  }
  return;
}

Assistant:

void AnimResolver::ClearAnimRangeSetup()
{
    for (std::list<LWO::Envelope>::iterator it = envelopes.begin(); it != envelopes.end(); ++it) {

        (*it).keys.erase((*it).keys.begin(),(*it).keys.begin()+(*it).old_first);
        (*it).keys.erase((*it).keys.begin()+(*it).old_last+1,(*it).keys.end());
    }
}